

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_math.cxx
# Opt level: O3

void ndiTransformToMatrixfd(float *trans,double *matrix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  fVar4 = (float)*(undefined8 *)trans;
  fVar5 = (float)((ulong)*(undefined8 *)trans >> 0x20);
  matrix[3] = 0.0;
  fVar7 = (float)((ulong)*(undefined8 *)(trans + 2) >> 0x20);
  fVar6 = (float)*(undefined8 *)(trans + 2);
  dVar10 = (double)(fVar5 * fVar5) + (double)(fVar6 * fVar6) + (double)(fVar7 * fVar7);
  dVar8 = ((double)(fVar4 * fVar4) - dVar10) * 0.5;
  dVar9 = 2.0 / (dVar10 + (double)(fVar4 * fVar4));
  dVar10 = ((double)(fVar6 * fVar5) + (double)(fVar7 * fVar4)) * dVar9;
  auVar2._8_4_ = SUB84(dVar10,0);
  auVar2._0_8_ = (dVar8 + (double)(fVar5 * fVar5)) * dVar9;
  auVar2._12_4_ = (int)((ulong)dVar10 >> 0x20);
  *(undefined1 (*) [16])matrix = auVar2;
  matrix[2] = ((double)(fVar7 * fVar5) - (double)(fVar4 * fVar6)) * dVar9;
  matrix[4] = ((double)(fVar6 * fVar5) - (double)(fVar7 * fVar4)) * dVar9;
  dVar10 = ((double)(fVar4 * fVar5) + (double)(fVar6 * fVar7)) * dVar9;
  auVar3._8_4_ = SUB84(dVar10,0);
  auVar3._0_8_ = (dVar8 + (double)(fVar6 * fVar6)) * dVar9;
  auVar3._12_4_ = (int)((ulong)dVar10 >> 0x20);
  *(undefined1 (*) [16])(matrix + 5) = auVar3;
  matrix[7] = 0.0;
  matrix[8] = ((double)(fVar4 * fVar6) + (double)(fVar7 * fVar5)) * dVar9;
  matrix[9] = ((double)(fVar6 * fVar7) - (double)(fVar4 * fVar5)) * dVar9;
  matrix[10] = (dVar8 + (double)(fVar7 * fVar7)) * dVar9;
  matrix[0xb] = 0.0;
  dVar10 = (double)(float)((ulong)*(undefined8 *)(trans + 4) >> 0x20);
  auVar1._8_4_ = SUB84(dVar10,0);
  auVar1._0_8_ = (double)(float)*(undefined8 *)(trans + 4);
  auVar1._12_4_ = (int)((ulong)dVar10 >> 0x20);
  *(undefined1 (*) [16])(matrix + 0xc) = auVar1;
  matrix[0xe] = (double)trans[6];
  matrix[0xf] = 1.0;
  return;
}

Assistant:

ndicapiExport void ndiTransformToMatrixfd(const float trans[8], double matrix[16])
{
  double ww, xx, yy, zz, wx, wy, wz, xy, xz, yz, ss, rr, f;

  /* Determine some calculations done more than once. */
  ww = trans[0] * trans[0];
  xx = trans[1] * trans[1];
  yy = trans[2] * trans[2];
  zz = trans[3] * trans[3];
  wx = trans[0] * trans[1];
  wy = trans[0] * trans[2];
  wz = trans[0] * trans[3];
  xy = trans[1] * trans[2];
  xz = trans[1] * trans[3];
  yz = trans[2] * trans[3];

  rr = xx + yy + zz;
  ss = (ww - rr) * 0.5;
  /* Normalization factor */
  f = 2.0 / (ww + rr);

  /* Fill in the matrix. */
  matrix[0]  = (ss + xx) * f;
  matrix[1]  = (wz + xy) * f;
  matrix[2]  = (-wy + xz) * f;
  matrix[3]  = 0;
  matrix[4]  = (-wz + xy) * f;
  matrix[5]  = (ss + yy) * f;
  matrix[6]  = (wx + yz) * f;
  matrix[7]  = 0;
  matrix[8]  = (wy + xz) * f;
  matrix[9]  = (-wx + yz) * f;
  matrix[10] = (ss + zz) * f;
  matrix[11] = 0;
  matrix[12] = trans[4];
  matrix[13] = trans[5];
  matrix[14] = trans[6];
  matrix[15] = 1;
}